

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O0

void __thiscall QFutureInterfaceBasePrivate::Data::setException(Data *this,exception_ptr *e)

{
  long lVar1;
  ResultStoreBase *in_RDI;
  long in_FS_OFFSET;
  exception_ptr *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::ResultStoreBase::~ResultStoreBase(in_RDI);
  in_RDI->_vptr_ResultStoreBase = (_func_int **)0x0;
  QtPrivate::ExceptionStore::ExceptionStore((ExceptionStore *)0x6e2450);
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)in_RDI,in_stack_ffffffffffffffb8);
  QtPrivate::ExceptionStore::setException((ExceptionStore *)in_RDI,in_stack_ffffffffffffffb8);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setException(const std::exception_ptr &e)
        {
            m_results.~ResultStoreBase();
            new (&m_exceptionStore) QtPrivate::ExceptionStore();
            m_exceptionStore.setException(e);
        }